

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

hash_node * ggml_gallocr_hash_get(ggml_gallocr_t galloc,ggml_tensor *t)

{
  size_t sVar1;
  ggml_tensor *in_RSI;
  ggml_hash_set *in_RDI;
  size_t i;
  
  sVar1 = ggml_hash_find_or_insert(in_RDI,in_RSI);
  return (hash_node *)(in_RDI[2].used + sVar1 * 8);
}

Assistant:

static struct hash_node * ggml_gallocr_hash_get(ggml_gallocr_t galloc, struct ggml_tensor * t) {
    size_t i = ggml_hash_find_or_insert(&galloc->hash_set, t);
    return &galloc->hash_values[i];
}